

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_context.h
# Opt level: O1

void __thiscall
mocker::ir::BuilderContext::
emplaceInst<mocker::ir::Call,std::shared_ptr<mocker::ir::Reg>&,char_const(&)[12],std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
          (BuilderContext *this,shared_ptr<mocker::ir::Reg> *args,char (*args_1) [12],
          shared_ptr<mocker::ir::Addr> *args_2,shared_ptr<mocker::ir::Addr> *args_3)

{
  shared_ptr<mocker::ir::Call> inst;
  undefined1 local_31;
  Call *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  shared_ptr<mocker::ir::IRInst> local_20;
  
  local_30 = (Call *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Call,std::allocator<mocker::ir::Call>,std::shared_ptr<mocker::ir::Reg>&,char_const(&)[12],std::shared_ptr<mocker::ir::Addr>,std::shared_ptr<mocker::ir::Addr>>
            (&_Stack_28,&local_30,(allocator<mocker::ir::Call> *)&local_31,args,args_1,args_2,args_3
            );
  local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_30->super_IRInst;
  local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_28._M_pi;
  local_30 = (Call *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  appendInst(this,&local_20);
  if (local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_28._M_pi);
  }
  return;
}

Assistant:

void emplaceInst(Args &&... args) {
    auto inst = std::make_shared<InstType>(std::forward<Args>(args)...);
    appendInst(std::move(inst));
  }